

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(ImGuiContext *context)

{
  value_type *ppIVar1;
  value_type *pvVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  ImGuiContext *g;
  ImGuiContext *context_local;
  
  if (((context->IO).Fonts != (ImFontAtlas *)0x0) && ((context->FontAtlasOwnedByContext & 1U) != 0))
  {
    IM_DELETE<ImFontAtlas>((context->IO).Fonts);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  if ((context->Initialized & 1U) != 0) {
    if ((context->SettingsLoaded & 1U) != 0) {
      SaveIniSettingsToDisk((context->IO).IniFilename);
    }
    for (local_1c = 0; local_1c < (context->Windows).Size; local_1c = local_1c + 1) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&context->Windows,local_1c);
      IM_DELETE<ImGuiWindow>(*ppIVar1);
    }
    ImVector<ImGuiWindow_*>::clear(&context->Windows);
    ImVector<ImGuiWindow_*>::clear(&context->WindowsSortBuffer);
    context->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear(&context->CurrentWindowStack);
    ImGuiStorage::Clear(&context->WindowsById);
    context->NavWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->HoveredRootWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColMod>::clear(&context->ColorModifiers);
    ImVector<ImGuiStyleMod>::clear(&context->StyleModifiers);
    ImVector<ImFont_*>::clear(&context->FontStack);
    ImVector<ImGuiPopupRef>::clear(&context->OpenPopupStack);
    ImVector<ImGuiPopupRef>::clear(&context->CurrentPopupStack);
    ImDrawDataBuilder::ClearFreeMemory(&context->DrawDataBuilder);
    ImDrawList::ClearFreeMemory(&context->OverlayDrawList);
    ImVector<char>::clear(&context->PrivateClipboard);
    ImVector<unsigned_short>::clear(&(context->InputTextState).Text);
    ImVector<char>::clear(&(context->InputTextState).InitialText);
    ImVector<char>::clear(&(context->InputTextState).TempTextBuffer);
    for (local_20 = 0; local_20 < (context->SettingsWindows).Size; local_20 = local_20 + 1) {
      pvVar2 = ImVector<ImGuiWindowSettings>::operator[](&context->SettingsWindows,local_20);
      IM_DELETE<char>(pvVar2->Name);
    }
    ImVector<ImGuiWindowSettings>::clear(&context->SettingsWindows);
    ImVector<ImGuiSettingsHandler>::clear(&context->SettingsHandlers);
    if ((context->LogFile != (FILE *)0x0) && (context->LogFile != _stdout)) {
      fclose((FILE *)context->LogFile);
      context->LogFile = (FILE *)0x0;
    }
    if (context->LogClipboard != (ImGuiTextBuffer *)0x0) {
      IM_DELETE<ImGuiTextBuffer>(context->LogClipboard);
    }
    context->LogClipboard = (ImGuiTextBuffer *)0x0;
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    ImGuiContext& g = *context;

    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
        IM_DELETE(g.IO.Fonts);
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialize ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded)
        SaveIniSettingsToDisk(g.IO.IniFilename);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = NULL;
    g.HoveredRootWindow = NULL;
    g.ActiveIdWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.CurrentPopupStack.clear();
    g.DrawDataBuilder.ClearFreeMemory();
    g.OverlayDrawList.ClearFreeMemory();
    g.PrivateClipboard.clear();
    g.InputTextState.Text.clear();
    g.InputTextState.InitialText.clear();
    g.InputTextState.TempTextBuffer.clear();

    for (int i = 0; i < g.SettingsWindows.Size; i++)
        IM_DELETE(g.SettingsWindows[i].Name);
    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile && g.LogFile != stdout)
    {
        fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard)
        IM_DELETE(g.LogClipboard);
    g.LogClipboard = NULL;

    g.Initialized = false;
}